

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O3

void wasm::
     PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
     ::scan(StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>
            *self,Expression **currp)

{
  char *__function;
  Expression *currp_00;
  Expression *pEVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
  *pPVar5;
  _func_void_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>_ptr_Expression_ptr_ptr
  *local_40;
  Expression *local_38;
  
  pEVar1 = *currp;
  switch(pEVar1->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
                       ,0xb0);
  case BlockId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
              ).
              super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ;
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&pPVar5->
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitBlock,currp);
    if (pEVar1->_id != BlockId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Block]";
      goto LAB_006a42cc;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) {
LAB_006a3f4f:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
        ::pushTask(&pPVar5->
                    super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                   ,scan,(Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case IfId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
              ).
              super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ;
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&pPVar5->
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitIf,currp);
    if (pEVar1->_id != IfId) {
      __function = "T *wasm::Expression::cast() [T = wasm::If]";
      goto LAB_006a42cc;
    }
    local_38 = pEVar1 + 2;
    local_40 = scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>,wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>,wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                     ).
                     super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                     .
                     super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                     .stack,&local_40,(Expression ***)&local_38);
    }
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&pPVar5->
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,scan,(Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_006a3e94;
  case LoopId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitLoop,currp);
    if (pEVar1->_id != LoopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3af6;
  case BreakId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitBreak,currp);
    if (pEVar1->_id != BreakId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Break]";
      goto LAB_006a42cc;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>,wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>,wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                     ).
                     super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                     .
                     super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                     .stack,&local_40,(Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    if (*(long *)(pEVar1 + 2) == 0) {
      return;
    }
    goto LAB_006a370b;
  case SwitchId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
              ).
              super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ;
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&pPVar5->
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitSwitch,currp);
    if (pEVar1->_id != SwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Switch]";
      goto LAB_006a42cc;
    }
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&pPVar5->
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,scan,(Expression **)&pEVar1[4].type);
    local_38 = pEVar1 + 4;
    lVar4 = *(long *)(pEVar1 + 4);
    goto joined_r0x006a3499;
  case CallId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
              ).
              super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ;
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&pPVar5->
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitCall,currp);
    if (pEVar1->_id != CallId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Call]";
      goto LAB_006a42cc;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_006a3f4f;
        Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
        ::pushTask(&pPVar5->
                    super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                   ,scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case CallIndirectId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
              ).
              super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ;
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&pPVar5->
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitCallIndirect,currp);
    if (pEVar1->_id != CallIndirectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallIndirect]";
      goto LAB_006a42cc;
    }
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&pPVar5->
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,scan,(Expression **)&pEVar1[3].type);
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 2)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 2) & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (*(ulong *)(pEVar1 + 2) <= uVar3 - 2) goto LAB_006a3f4f;
        Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
        ::pushTask(&pPVar5->
                    super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                   ,scan,(Expression **)(pEVar1[1].type.id + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case LocalGetId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitLocalGet,currp);
    if (pEVar1->_id != LocalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
      goto LAB_006a42cc;
    }
    break;
  case LocalSetId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitLocalSet,currp);
    if (pEVar1->_id != LocalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3bf8;
  case GlobalGetId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitGlobalGet,currp);
    if (pEVar1->_id != GlobalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalGet]";
      goto LAB_006a42cc;
    }
    break;
  case GlobalSetId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitGlobalSet,currp);
    if (pEVar1->_id != GlobalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalSet]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3af6;
  case LoadId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitLoad,currp);
    if (pEVar1->_id == LoadId) {
      pEVar1 = pEVar1 + 3;
      goto LAB_006a3e94;
    }
    __function = "T *wasm::Expression::cast() [T = wasm::Load]";
    goto LAB_006a42cc;
  case StoreId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitStore,currp);
    if (pEVar1->_id != StoreId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Store]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3bbd;
  case ConstId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitConst,currp);
    if (pEVar1->_id != ConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Const]";
      goto LAB_006a42cc;
    }
    break;
  case UnaryId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitUnary,currp);
    if (pEVar1->_id != UnaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unary]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3bf8;
  case BinaryId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitBinary,currp);
    if (pEVar1->_id != BinaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Binary]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3e74;
  case SelectId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitSelect,currp);
    if (pEVar1->_id != SelectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Select]";
      goto LAB_006a42cc;
    }
    goto LAB_006a37ea;
  case DropId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitDrop,currp);
    if (pEVar1->_id != DropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Drop]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3e48;
  case ReturnId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitReturn,currp);
    if (pEVar1->_id != ReturnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Return]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3490;
  case MemorySizeId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitMemorySize,currp);
    if (pEVar1->_id != MemorySizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemorySize]";
      goto LAB_006a42cc;
    }
    break;
  case MemoryGrowId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitMemoryGrow,currp);
    if (pEVar1->_id != MemoryGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryGrow]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3e48;
  case NopId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitNop,currp);
    if (pEVar1->_id != NopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Nop]";
      goto LAB_006a42cc;
    }
    break;
  case UnreachableId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitUnreachable,currp);
    if (pEVar1->_id != UnreachableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unreachable]";
      goto LAB_006a42cc;
    }
    break;
  case AtomicRMWId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitAtomicRMW,currp);
    if (pEVar1->_id != AtomicRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicRMW]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3ca3;
  case AtomicCmpxchgId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitAtomicCmpxchg,currp);
    if (pEVar1->_id != AtomicCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicCmpxchg]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3c89;
  case AtomicWaitId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitAtomicWait,currp);
    if (pEVar1->_id != AtomicWaitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicWait]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3317;
  case AtomicNotifyId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitAtomicNotify,currp);
    if (pEVar1->_id != AtomicNotifyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicNotify]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3e74;
  case AtomicFenceId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitAtomicFence,currp);
    if (pEVar1->_id != AtomicFenceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicFence]";
      goto LAB_006a42cc;
    }
    break;
  case SIMDExtractId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitSIMDExtract,currp);
    if (pEVar1->_id != SIMDExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDExtract]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3bf8;
  case SIMDReplaceId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitSIMDReplace,currp);
    if (pEVar1->_id != SIMDReplaceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDReplace]";
      goto LAB_006a42cc;
    }
    currp_00 = (Expression *)&pEVar1[2].type;
    goto LAB_006a3e7f;
  case SIMDShuffleId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitSIMDShuffle,currp);
    if (pEVar1->_id != SIMDShuffleId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShuffle]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3de6;
  case SIMDTernaryId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitSIMDTernary,currp);
    if (pEVar1->_id != SIMDTernaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDTernary]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3317;
  case SIMDShiftId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitSIMDShift,currp);
    if (pEVar1->_id != SIMDShiftId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShift]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3e74;
  case SIMDLoadId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitSIMDLoad,currp);
    if (pEVar1->_id != SIMDLoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoad]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3a1f;
  case SIMDLoadStoreLaneId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitSIMDLoadStoreLane,currp);
    if (pEVar1->_id != SIMDLoadStoreLaneId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoadStoreLane]";
      goto LAB_006a42cc;
    }
LAB_006a3bbd:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,scan,(Expression **)&pEVar1[3].type);
    pEVar1 = pEVar1 + 3;
    goto LAB_006a3e94;
  case MemoryInitId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitMemoryInit,currp);
    if (pEVar1->_id != MemoryInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryInit]";
      goto LAB_006a42cc;
    }
LAB_006a3c89:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,scan,(Expression **)(pEVar1 + 3));
    goto LAB_006a3ca3;
  case DataDropId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitDataDrop,currp);
    if (pEVar1->_id != DataDropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::DataDrop]";
      goto LAB_006a42cc;
    }
    break;
  case MemoryCopyId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitMemoryCopy,currp);
    if (pEVar1->_id != MemoryCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryCopy]";
      goto LAB_006a42cc;
    }
    goto LAB_006a37ea;
  case MemoryFillId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitMemoryFill,currp);
    if (pEVar1->_id != MemoryFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryFill]";
      goto LAB_006a42cc;
    }
    goto LAB_006a37ea;
  case PopId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitPop,currp);
    if (pEVar1->_id != PopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Pop]";
      goto LAB_006a42cc;
    }
    break;
  case RefNullId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitRefNull,currp);
    if (pEVar1->_id != RefNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefNull]";
      goto LAB_006a42cc;
    }
    break;
  case RefIsNullId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitRefIsNull,currp);
    if (pEVar1->_id != RefIsNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefIsNull]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3e48;
  case RefFuncId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitRefFunc,currp);
    if (pEVar1->_id != RefFuncId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefFunc]";
      goto LAB_006a42cc;
    }
    break;
  case RefEqId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitRefEq,currp);
    if (pEVar1->_id != RefEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefEq]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3de6;
  case TableGetId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitTableGet,currp);
    if (pEVar1->_id != TableGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGet]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3af6;
  case TableSetId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitTableSet,currp);
    if (pEVar1->_id != TableSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSet]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3ca3;
  case TableSizeId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitTableSize,currp);
    if (pEVar1->_id != TableSizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSize]";
      goto LAB_006a42cc;
    }
    break;
  case TableGrowId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitTableGrow,currp);
    if (pEVar1->_id != TableGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGrow]";
      goto LAB_006a42cc;
    }
LAB_006a3ca3:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,scan,(Expression **)&pEVar1[2].type);
    pEVar1 = pEVar1 + 2;
    goto LAB_006a3e94;
  case TryId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
              ).
              super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ;
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&pPVar5->
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitTry,currp);
    if (pEVar1->_id != TryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Try]";
      goto LAB_006a42cc;
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 5)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 5) & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (*(ulong *)(pEVar1 + 5) <= uVar3 - 2) goto LAB_006a3f4f;
        Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
        ::pushTask(&pPVar5->
                    super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                   ,scan,(Expression **)(pEVar1[4].type.id + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
LAB_006a3af6:
    pEVar1 = pEVar1 + 2;
    goto LAB_006a3e94;
  case ThrowId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
              ).
              super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ;
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&pPVar5->
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitThrow,currp);
    if (pEVar1->_id != ThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Throw]";
      goto LAB_006a42cc;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) goto LAB_006a3f4f;
        Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
        ::pushTask(&pPVar5->
                    super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                   ,scan,(Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case RethrowId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitRethrow,currp);
    if (pEVar1->_id != RethrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Rethrow]";
      goto LAB_006a42cc;
    }
    break;
  case TupleMakeId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
              ).
              super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ;
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&pPVar5->
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitTupleMake,currp);
    if (pEVar1->_id != TupleMakeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleMake]";
      goto LAB_006a42cc;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_006a3f4f;
        Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
        ::pushTask(&pPVar5->
                    super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                   ,scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case TupleExtractId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitTupleExtract,currp);
    if (pEVar1->_id != TupleExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleExtract]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3e48;
  case I31NewId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitI31New,currp);
    if (pEVar1->_id != I31NewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31New]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3e48;
  case I31GetId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitI31Get,currp);
    if (pEVar1->_id != I31GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31Get]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3e48;
  case CallRefId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
              ).
              super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ;
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&pPVar5->
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitCallRef,currp);
    if (pEVar1->_id != CallRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallRef]";
      goto LAB_006a42cc;
    }
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&pPVar5->
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,scan,(Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_006a3f4f;
        Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
        ::pushTask(&pPVar5->
                    super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                   ,scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case RefTestId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitRefTest,currp);
    if (pEVar1->_id != RefTestId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefTest]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3e48;
  case RefCastId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitRefCast,currp);
    if (pEVar1->_id != RefCastId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefCast]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3e48;
  case BrOnId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitBrOn,currp);
    if (pEVar1->_id != BrOnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::BrOn]";
      goto LAB_006a42cc;
    }
LAB_006a3a1f:
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_006a3e94;
  case StructNewId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
              ).
              super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ;
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&pPVar5->
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitStructNew,currp);
    if (pEVar1->_id != StructNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructNew]";
      goto LAB_006a42cc;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_006a3f4f;
        Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
        ::pushTask(&pPVar5->
                    super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                   ,scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case StructGetId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitStructGet,currp);
    if (pEVar1->_id != StructGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructGet]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3bf8;
  case StructSetId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitStructSet,currp);
    if (pEVar1->_id != StructSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructSet]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3e74;
  case ArrayNewId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
              ).
              super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ;
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&pPVar5->
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitArrayNew,currp);
    if (pEVar1->_id != ArrayNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNew]";
      goto LAB_006a42cc;
    }
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&pPVar5->
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,scan,(Expression **)&pEVar1[1].type);
LAB_006a3490:
    local_38 = pEVar1 + 1;
    lVar4 = *(long *)(pEVar1 + 1);
joined_r0x006a3499:
    if (lVar4 != 0) {
LAB_006a370b:
      local_40 = scan;
      SmallVector<wasm::Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>,wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>,wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                     ).
                     super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                     .
                     super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                     .stack,&local_40,(Expression ***)&local_38);
    }
    break;
  case ArrayNewSegId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitArrayNewSeg,currp);
    if (pEVar1->_id != ArrayNewSegId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewSeg]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3540;
  case ArrayNewFixedId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
              ).
              super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ;
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&pPVar5->
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitArrayNewFixed,currp);
    if (pEVar1->_id != ArrayNewFixedId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewFixed]";
      goto LAB_006a42cc;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_006a3f4f;
        Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
        ::pushTask(&pPVar5->
                    super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                   ,scan,(Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case ArrayGetId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitArrayGet,currp);
    if (pEVar1->_id != ArrayGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayGet]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3de6;
  case ArraySetId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitArraySet,currp);
    if (pEVar1->_id != ArraySetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArraySet]";
      goto LAB_006a42cc;
    }
    goto LAB_006a37ea;
  case ArrayLenId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitArrayLen,currp);
    if (pEVar1->_id != ArrayLenId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayLen]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3e48;
  case ArrayCopyId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
              ).
              super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ;
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&pPVar5->
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitArrayCopy,currp);
    if (pEVar1->_id != ArrayCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayCopy]";
      goto LAB_006a42cc;
    }
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&pPVar5->
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,scan,(Expression **)(pEVar1 + 3));
    goto LAB_006a32b1;
  case ArrayFillId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitArrayFill,currp);
    if (pEVar1->_id != ArrayFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayFill]";
      goto LAB_006a42cc;
    }
LAB_006a32b1:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,scan,(Expression **)&pEVar1[2].type);
    goto LAB_006a37ea;
  case ArrayInitId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
              ).
              super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ;
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&pPVar5->
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitArrayInit,currp);
    if (pEVar1->_id != ArrayInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInit]";
      goto LAB_006a42cc;
    }
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&pPVar5->
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,scan,(Expression **)(pEVar1 + 4));
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&pPVar5->
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,scan,(Expression **)&pEVar1[3].type);
LAB_006a3540:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,scan,(Expression **)(pEVar1 + 3));
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_006a3e94;
  case RefAsId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitRefAs,currp);
    if (pEVar1->_id != RefAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefAs]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3bf8;
  case StringNewId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitStringNew,currp);
    if (pEVar1->_id == StringNewId) {
      local_38 = pEVar1 + 3;
      local_40 = scan;
      if (*(long *)(pEVar1 + 3) != 0) {
        SmallVector<wasm::Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>,wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>,void>>::Task,10ul>
        ::
        emplace_back<void(*&)(wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>*,wasm::Expression**),wasm::Expression**&>
                  ((SmallVector<wasm::Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>,wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>,void>>::Task,10ul>
                    *)&(self->
                       super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                       ).
                       super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                       .
                       super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                       .stack,&local_40,(Expression ***)&local_38);
      }
      local_38 = (Expression *)&pEVar1[2].type;
      local_40 = scan;
      if (pEVar1[2].type.id != 0) {
        SmallVector<wasm::Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>,wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>,void>>::Task,10ul>
        ::
        emplace_back<void(*&)(wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>*,wasm::Expression**),wasm::Expression**&>
                  ((SmallVector<wasm::Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>,wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>,void>>::Task,10ul>
                    *)&(self->
                       super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                       ).
                       super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                       .
                       super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                       .stack,&local_40,(Expression ***)&local_38);
      }
      local_38 = pEVar1 + 2;
      local_40 = scan;
      if (*(long *)(pEVar1 + 2) != 0) {
        SmallVector<wasm::Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>,wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>,void>>::Task,10ul>
        ::
        emplace_back<void(*&)(wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>*,wasm::Expression**),wasm::Expression**&>
                  ((SmallVector<wasm::Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>,wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>,void>>::Task,10ul>
                    *)&(self->
                       super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                       ).
                       super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                       .
                       super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                       .stack,&local_40,(Expression ***)&local_38);
      }
      pEVar1 = (Expression *)&pEVar1[1].type;
      goto LAB_006a3e94;
    }
    __function = "T *wasm::Expression::cast() [T = wasm::StringNew]";
    goto LAB_006a42cc;
  case StringConstId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitStringConst,currp);
    if (pEVar1->_id != StringConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConst]";
      goto LAB_006a42cc;
    }
    break;
  case StringMeasureId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitStringMeasure,currp);
    if (pEVar1->_id != StringMeasureId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringMeasure]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3bf8;
  case StringEncodeId:
    pPVar5 = &(self->
              super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
              ).
              super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ;
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&pPVar5->
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitStringEncode,currp);
    if (pEVar1->_id == StringEncodeId) {
      local_38 = (Expression *)&pEVar1[2].type;
      local_40 = scan;
      if (pEVar1[2].type.id != 0) {
        SmallVector<wasm::Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>,wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>,void>>::Task,10ul>
        ::
        emplace_back<void(*&)(wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>*,wasm::Expression**),wasm::Expression**&>
                  ((SmallVector<wasm::Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>,wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,wasm::(anonymous_namespace)::PCVScanner>,void>>::Task,10ul>
                    *)&(self->
                       super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                       ).
                       super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                       .
                       super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                       .stack,&local_40,(Expression ***)&local_38);
      }
      Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
      ::pushTask(&pPVar5->
                  super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                 ,scan,(Expression **)(pEVar1 + 2));
      pEVar1 = (Expression *)&pEVar1[1].type;
      goto LAB_006a3e94;
    }
    __function = "T *wasm::Expression::cast() [T = wasm::StringEncode]";
LAB_006a42cc:
    __assert_fail("int(_id) == int(T::SpecificId)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                  ,0x314,__function);
  case StringConcatId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitStringConcat,currp);
    if (pEVar1->_id != StringConcatId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConcat]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3de6;
  case StringEqId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitStringEq,currp);
    if (pEVar1->_id != StringEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEq]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3e74;
  case StringAsId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitStringAs,currp);
    if (pEVar1->_id != StringAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringAs]";
      goto LAB_006a42cc;
    }
LAB_006a3bf8:
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_006a3e94;
  case StringWTF8AdvanceId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitStringWTF8Advance,currp);
    if (pEVar1->_id != StringWTF8AdvanceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF8Advance]";
      goto LAB_006a42cc;
    }
LAB_006a37ea:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,scan,(Expression **)(pEVar1 + 2));
    goto LAB_006a3de6;
  case StringWTF16GetId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitStringWTF16Get,currp);
    if (pEVar1->_id != StringWTF16GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF16Get]";
      goto LAB_006a42cc;
    }
    goto LAB_006a3de6;
  case StringIterNextId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitStringIterNext,currp);
    if (pEVar1->_id != StringIterNextId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterNext]";
      goto LAB_006a42cc;
    }
LAB_006a3e48:
    pEVar1 = pEVar1 + 1;
LAB_006a3e94:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,scan,(Expression **)pEVar1);
    return;
  case StringIterMoveId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitStringIterMove,currp);
    if (pEVar1->_id != StringIterMoveId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterMove]";
      goto LAB_006a42cc;
    }
LAB_006a3e74:
    currp_00 = pEVar1 + 2;
LAB_006a3e7f:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,scan,(Expression **)currp_00);
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_006a3e94;
  case StringSliceWTFId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitStringSliceWTF,currp);
    if (pEVar1->_id != StringSliceWTFId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceWTF]";
      goto LAB_006a42cc;
    }
LAB_006a3317:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,scan,(Expression **)&pEVar1[2].type);
    currp_00 = pEVar1 + 2;
    goto LAB_006a3e7f;
  case StringSliceIterId:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                ::doVisitStringSliceIter,currp);
    if (pEVar1->_id != StringSliceIterId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceIter]";
      goto LAB_006a42cc;
    }
LAB_006a3de6:
    Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
    ::pushTask(&(self->
                super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                ).
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                .
                super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
               ,scan,(Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_006a3e94;
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_INT_ARRAY(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }